

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_connect_on_ready_tls(intptr_t uuid,fio_protocol_s *pr_)

{
  fio_connect_protocol_s *pr;
  
  if (pr_->on_ready != mock_on_ev) {
    pr_->on_ready = mock_on_ev;
    pr_[1].ping = (_func_void_intptr_t_fio_protocol_s_ptr *)0x0;
    fio_tls_connect(uuid,pr_[1].on_shutdown,pr_[1].on_ready);
    (*pr_[1].on_close)(uuid,(fio_protocol_s *)pr_[1].on_ready);
    fio_poll_add((long)(int)((ulong)uuid >> 8));
    return;
  }
  return;
}

Assistant:

static void fio_connect_on_ready_tls(intptr_t uuid, fio_protocol_s *pr_) {
  fio_connect_protocol_s *pr = (fio_connect_protocol_s *)pr_;
  if (pr->pr.on_ready == mock_on_ev)
    return; /* Don't call on_connect more than once */
  pr->pr.on_ready = mock_on_ev;
  pr->on_fail = NULL;
  fio_tls_connect(uuid, pr->tls, pr->udata);
  pr->on_connect(uuid, pr->udata);
  fio_poll_add(fio_uuid2fd(uuid));
  (void)uuid;
}